

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniformxx.hpp
# Opt level: O0

ret_t_conflict1 *
trng::utility::
u01xx_traits<long_double,_1UL,_generator_max<trng::lagfib2plus<unsigned_int,_168U,_521U>_>_>::addin
          (generator_max<trng::lagfib2plus<unsigned_int,_168U,_521U>_> *r)

{
  result_type rVar1;
  result_type rVar2;
  result_type x;
  
  rVar1 = generator_max<trng::lagfib2plus<unsigned_int,_168U,_521U>_>::operator()
                    ((generator_max<trng::lagfib2plus<unsigned_int,_168U,_521U>_> *)0x2db083);
  rVar2 = generator_min_max<trng::lagfib2plus<unsigned_int,_168U,_521U>_>::min();
  return (ret_t_conflict1 *)(ulong)(rVar1 - rVar2);
}

Assistant:

TRNG_CUDA_ENABLE
      static ret_t addin(prng_t &r) {
        const result_type x{r() - prng_t::min()};
        if (int_ok)
          return static_cast<ret_t>(static_cast<int>(x));
        else if (long_ok)
          return static_cast<ret_t>(static_cast<long>(x));
        else if (long_long_ok)
          return static_cast<ret_t>(static_cast<long long>(x));
        else if (use_ll_of_shifted)
          return static_cast<ret_t>(static_cast<long long>(x >> 1));
        else
          return static_cast<ret_t>(x);
      }